

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O3

int i2cReadWordData(uint handle,uint reg)

{
  FILE *__stream;
  int iVar1;
  uint uVar2;
  my_smbus_data data;
  my_smbus_data local_3a;
  
  __stream = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(__stream,"%s %s: handle=%d reg=%d\n",myTimeStamp::buf,"i2cReadWordData",(ulong)handle,
            reg);
  }
  if (libInitialised == '\0') {
    uVar2 = 0xffffffe1;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      i2cReadWordData_cold_1();
    }
  }
  else if (handle < 0x40) {
    if (i2cInfo[handle].state == 2) {
      if ((i2cInfo[handle].funcs & 0x200000) == 0) {
        uVar2 = 0xffffff95;
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          i2cReadWordData_cold_5();
        }
      }
      else if (reg < 0x100) {
        iVar1 = my_smbus_access((int)i2cInfo[handle].fd,'\x01',(uint8_t)reg,3,&local_3a);
        if (iVar1 < 0) {
          uVar2 = 0xffffffad;
          if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
            i2cReadWordData_cold_3();
          }
        }
        else {
          uVar2 = (uint)local_3a.word;
        }
      }
      else {
        uVar2 = 0xffffffaf;
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          i2cReadWordData_cold_4();
        }
      }
    }
    else {
      uVar2 = 0xffffffe7;
      if ((gpioCfg.internals >> 10 & 1) == 0) {
        i2cReadWordData_cold_2();
      }
    }
  }
  else {
    uVar2 = 0xffffffe7;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      i2cReadWordData_cold_6();
    }
  }
  return uVar2;
}

Assistant:

int i2cReadWordData(unsigned handle, unsigned reg)
{
   union my_smbus_data data;
   int status;

   DBG(DBG_USER, "handle=%d reg=%d", handle, reg);

   CHECK_INITED;

   if (handle >= PI_I2C_SLOTS)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (i2cInfo[handle].state != PI_I2C_OPENED)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if ((i2cInfo[handle].funcs & PI_I2C_FUNC_SMBUS_READ_WORD_DATA) == 0)
      SOFT_ERROR(PI_BAD_SMBUS_CMD, "SMBUS command not supported by driver");

   if (reg > 0xFF)
      SOFT_ERROR(PI_BAD_PARAM, "bad reg (%d)", reg);

   status = (my_smbus_access(
      i2cInfo[handle].fd,
      PI_I2C_SMBUS_READ,
      reg,
      PI_I2C_SMBUS_WORD_DATA,
      &data));

   if (status < 0)
   {
      DBG(DBG_USER, "error=%d (%m)", status);
      return PI_I2C_READ_FAILED;
   }

   return 0xFFFF & data.word;
}